

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__refill_buffer(stbi__context *s)

{
  stbi_uc *psVar1;
  int iVar2;
  stbi_uc *psVar3;
  
  psVar1 = s->buffer_start;
  iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
  if (iVar2 == 0) {
    s->read_from_callbacks = 0;
    psVar3 = s->buffer_start + 1;
    s->buffer_start[0] = '\0';
  }
  else {
    psVar3 = psVar1 + iVar2;
  }
  s->img_buffer = psVar1;
  s->img_buffer_end = psVar3;
  return;
}

Assistant:

static void stbi__refill_buffer(stbi__context *s)
{
   int n = (s->io.read)(s->io_user_data,(char*)s->buffer_start,s->buflen);
   if (n == 0) {
      // at end of file, treat same as if from memory, but need to handle case
      // where s->img_buffer isn't pointing to safe memory, e.g. 0-byte file
      s->read_from_callbacks = 0;
      s->img_buffer = s->buffer_start;
      s->img_buffer_end = s->buffer_start+1;
      *s->img_buffer = 0;
   } else {
      s->img_buffer = s->buffer_start;
      s->img_buffer_end = s->buffer_start + n;
   }
}